

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::UnitFlow::
increase<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
          (UnitFlow *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,int a)

{
  uint64_t uVar1;
  ConstRefIDIDFunc<ArrayIDIDFunc> *this_00;
  uint64_t in_RSI;
  undefined8 in_RDI;
  TinyIntIDFunc<2> *unaff_retaddr;
  uint64_t f;
  int id;
  TinyIntIDFunc<2> *in_stack_ffffffffffffffe0;
  int id_00;
  
  id = (int)((ulong)in_RDI >> 0x20);
  id_00 = id;
  uVar1 = TinyIntIDFunc<2>::operator()(in_stack_ffffffffffffffe0,id);
  this_00 = (ConstRefIDIDFunc<ArrayIDIDFunc> *)(uVar1 + 1);
  TinyIntIDFunc<2>::set(unaff_retaddr,id_00,in_RSI);
  ConstRefIDIDFunc<ArrayIDIDFunc>::operator()(this_00,id);
  TinyIntIDFunc<2>::set(unaff_retaddr,id_00,in_RSI);
  return;
}

Assistant:

void increase(const Graph& graph, int a)
    {
        auto f = flow(a);
        assert((f == 0 || f == 1) && "Flow is already maximum; can not be increased");
        assert(flow(graph.back_arc(a)) == 2 - f && "Back arc has invalid flow");
        ++f;
        flow.set(a, f);
        flow.set(graph.back_arc(a), 2 - f);
    }